

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleaction.hh
# Opt level: O3

void __thiscall RuleAddMultCollapse::RuleAddMultCollapse(RuleAddMultCollapse *this,string *g)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addmultcollapse","");
  Rule::Rule(&this->super_Rule,g,0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_003c5da8;
  return;
}

Assistant:

RuleAddMultCollapse(const string &g) : Rule(g, 0, "addmultcollapse") {}